

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Abc_BufAddToQue(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  size_t sVar1;
  int iVar2;
  Vec_Que_t *pVVar3;
  float *pfVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  iVar13 = (pObj->vFanouts).nSize;
  if ((p->nFanMin <= iVar13) &&
     ((p->fBufPis != 0 || ((uVar8 = *(uint *)&pObj->field_0x14 & 0xf, uVar8 != 2 && (uVar8 != 5)))))
     ) {
    iVar2 = pObj->Id;
    lVar18 = (long)iVar2;
    if ((lVar18 < 0) || (p->vCounts->nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
    }
    p->vCounts->pArray[lVar18] = (float)iVar13;
    pVVar3 = p->vQue;
    uVar8 = pVVar3->nCap;
    if (iVar2 < (int)uVar8) {
      piVar6 = pVVar3->pOrder;
      uVar17 = piVar6[lVar18];
      uVar11 = (ulong)(int)uVar17;
      if (-1 < (long)uVar11) {
        pfVar4 = *pVVar3->pCostsFlt;
        if (pfVar4 == (float *)0x0) {
          fVar19 = (float)iVar2;
        }
        else {
          fVar19 = pfVar4[lVar18];
        }
        piVar7 = pVVar3->pHeap;
        if (piVar7[uVar11] == iVar2) {
          if (uVar17 < 2) {
            piVar7[uVar11] = iVar2;
            piVar6[lVar18] = uVar17;
          }
          else {
            bVar15 = true;
            uVar14 = (ulong)uVar17;
            while( true ) {
              uVar14 = uVar14 >> 1;
              iVar13 = piVar7[uVar14];
              if (pfVar4 == (float *)0x0) {
                fVar20 = (float)iVar13;
              }
              else {
                fVar20 = pfVar4[iVar13];
              }
              uVar8 = (uint)uVar11;
              if (fVar19 <= fVar20) break;
              piVar7[uVar11 & 0xffffffff] = iVar13;
              piVar6[iVar13] = uVar8;
              bVar15 = false;
              uVar11 = uVar14;
              if (uVar8 < 4) {
                piVar7[uVar14] = iVar2;
                piVar6[lVar18] = (int)uVar14;
                return;
              }
            }
            piVar7[uVar11 & 0xffffffff] = iVar2;
            piVar6[lVar18] = uVar8;
            if (!bVar15) {
              return;
            }
          }
          if (pfVar4 == (float *)0x0) {
            fVar19 = (float)iVar2;
          }
          else {
            fVar19 = pfVar4[lVar18];
          }
          uVar8 = (int)uVar11 * 2;
          iVar13 = pVVar3->nSize;
          iVar10 = (int)uVar11;
          if ((int)uVar8 < iVar13) {
            do {
              iVar10 = (int)uVar11;
              uVar17 = uVar8 | 1;
              if ((int)uVar17 < iVar13) {
                if (pfVar4 == (float *)0x0) {
                  fVar20 = (float)piVar7[(int)uVar8];
                  fVar21 = (float)piVar7[(int)uVar17];
                }
                else {
                  fVar20 = pfVar4[piVar7[(int)uVar8]];
                  fVar21 = pfVar4[piVar7[(int)uVar17]];
                }
                uVar11 = (ulong)uVar8;
                if (fVar20 < fVar21) {
                  uVar11 = (ulong)uVar17;
                }
              }
              else {
                uVar11 = (ulong)uVar8;
              }
              iVar16 = (int)uVar11;
              if (iVar13 <= iVar16) {
                __assert_fail("child < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                              ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
              }
              iVar13 = piVar7[iVar16];
              if (pfVar4 == (float *)0x0) {
                fVar20 = (float)iVar13;
              }
              else {
                fVar20 = pfVar4[iVar13];
              }
              if (fVar20 <= fVar19) break;
              piVar7[iVar10] = iVar13;
              piVar6[iVar13] = iVar10;
              uVar8 = iVar16 * 2;
              iVar13 = pVVar3->nSize;
              iVar10 = iVar16;
            } while ((int)uVar8 < iVar13);
          }
          piVar7[iVar10] = iVar2;
          piVar6[lVar18] = iVar10;
          return;
        }
        goto LAB_00455c66;
      }
    }
    if ((int)uVar8 <= pVVar3->nSize) {
      uVar5 = pVVar3->nSize + 1;
      uVar17 = uVar8 * 2;
      iVar13 = uVar8 * -2;
      uVar8 = uVar17;
      if (uVar5 != uVar17 && SBORROW4(uVar5,uVar17) == (int)(uVar5 + iVar13) < 0) {
        uVar8 = uVar5;
      }
      lVar9 = (long)(int)uVar8;
      sVar1 = lVar9 * 4;
      if (pVVar3->pHeap == (int *)0x0) {
        piVar6 = (int *)malloc(sVar1);
      }
      else {
        piVar6 = (int *)realloc(pVVar3->pHeap,sVar1);
      }
      pVVar3->pHeap = piVar6;
      if (pVVar3->pOrder == (int *)0x0) {
        piVar7 = (int *)malloc(sVar1);
      }
      else {
        piVar7 = (int *)realloc(pVVar3->pOrder,sVar1);
        piVar6 = pVVar3->pHeap;
      }
      pVVar3->pOrder = piVar7;
      memset(piVar6 + pVVar3->nCap,0xff,(lVar9 - pVVar3->nCap) * 4);
      memset(pVVar3->pOrder + pVVar3->nCap,0xff,(lVar9 - pVVar3->nCap) * 4);
      pVVar3->nCap = uVar8;
    }
    if ((int)uVar8 <= iVar2) {
      uVar5 = iVar2 + 1;
      uVar17 = uVar8 * 2;
      iVar13 = uVar8 * -2;
      uVar8 = uVar17;
      if (uVar5 != uVar17 && SBORROW4(uVar5,uVar17) == (int)(uVar5 + iVar13) < 0) {
        uVar8 = uVar5;
      }
      sVar1 = (ulong)uVar8 * 4;
      if (pVVar3->pHeap == (int *)0x0) {
        piVar6 = (int *)malloc(sVar1);
      }
      else {
        piVar6 = (int *)realloc(pVVar3->pHeap,sVar1);
      }
      pVVar3->pHeap = piVar6;
      if (pVVar3->pOrder == (int *)0x0) {
        piVar7 = (int *)malloc(sVar1);
      }
      else {
        piVar7 = (int *)realloc(pVVar3->pOrder,sVar1);
        piVar6 = pVVar3->pHeap;
      }
      pVVar3->pOrder = piVar7;
      memset(piVar6 + pVVar3->nCap,0xff,((long)(int)uVar8 - (long)pVVar3->nCap) * 4);
      memset(pVVar3->pOrder + pVVar3->nCap,0xff,((long)(int)uVar8 - (long)pVVar3->nCap) * 4);
      pVVar3->nCap = uVar8;
    }
    iVar13 = pVVar3->nSize;
    if ((int)uVar8 <= iVar13) {
      __assert_fail("p->nSize < p->nCap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar6 = pVVar3->pOrder;
    if (piVar6[lVar18] != -1) {
      __assert_fail("p->pOrder[v] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar7 = pVVar3->pHeap;
    if (piVar7[iVar13] != -1) {
      __assert_fail("p->pHeap[p->nSize] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar6[lVar18] = iVar13;
    iVar13 = pVVar3->nSize;
    pVVar3->nSize = iVar13 + 1;
    piVar7[iVar13] = iVar2;
    pfVar4 = *pVVar3->pCostsFlt;
    if (pfVar4 == (float *)0x0) {
      fVar19 = (float)iVar2;
    }
    else {
      fVar19 = pfVar4[lVar18];
    }
    uVar8 = piVar6[lVar18];
    uVar11 = (ulong)(int)uVar8;
    if (uVar11 == 0xffffffffffffffff) {
      __assert_fail("p->pOrder[v] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    if (piVar7[uVar11] != iVar2) {
LAB_00455c66:
      __assert_fail("p->pHeap[i] == v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    if (1 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
      uVar12 = uVar11;
      do {
        uVar17 = (uint)uVar12;
        uVar14 = uVar14 >> 1;
        iVar13 = piVar7[uVar14];
        if (pfVar4 == (float *)0x0) {
          fVar20 = (float)iVar13;
        }
        else {
          fVar20 = pfVar4[iVar13];
        }
        uVar11 = uVar12 & 0xffffffff;
        uVar8 = uVar17;
        if (fVar19 <= fVar20) break;
        piVar7[uVar12 & 0xffffffff] = iVar13;
        piVar6[iVar13] = uVar17;
        uVar8 = (uint)uVar14;
        uVar12 = uVar14;
        uVar11 = uVar14;
      } while (3 < uVar17);
    }
    piVar7[uVar11] = iVar2;
    piVar6[lVar18] = uVar8;
  }
  return;
}

Assistant:

void Abc_BufAddToQue( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    if ( Abc_ObjFanoutNum(pObj) < p->nFanMin || (!p->fBufPis && Abc_ObjIsCi(pObj)) )
        return;
    Vec_FltWriteEntry( p->vCounts, Abc_ObjId(pObj), Abc_ObjFanoutNum(pObj) );
    if ( Vec_QueIsMember(p->vQue, Abc_ObjId(pObj)) )
        Vec_QueUpdate( p->vQue, Abc_ObjId(pObj) );
    else
        Vec_QuePush( p->vQue, Abc_ObjId(pObj) );
}